

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtransposeproxymodel.cpp
# Opt level: O0

QModelIndex * __thiscall QTransposeProxyModel::parent(QTransposeProxyModel *this,QModelIndex *index)

{
  long lVar1;
  bool bVar2;
  QTransposeProxyModelPrivate *this_00;
  parameter_type pQVar3;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  QTransposeProxyModelPrivate *d;
  QModelIndex *this_01;
  QModelIndex *in_stack_ffffffffffffffc8;
  QTransposeProxyModelPrivate *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_00 = d_func((QTransposeProxyModel *)0x8b39b4);
  pQVar3 = ::QObjectCompatProperty::operator_cast_to_QAbstractItemModel_
                     ((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                       *)0x8b39ca);
  if (pQVar3 != (parameter_type)0x0) {
    bVar2 = QModelIndex::isValid(this_01);
    if (bVar2) {
      QTransposeProxyModelPrivate::uncheckedMapToSource
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      QModelIndex::parent((QModelIndex *)this_00);
      QTransposeProxyModelPrivate::uncheckedMapFromSource
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      goto LAB_008b3a29;
    }
  }
  QModelIndex::QModelIndex((QModelIndex *)0x8b39e8);
LAB_008b3a29:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QModelIndex QTransposeProxyModel::parent(const QModelIndex &index) const
{
    Q_D(const QTransposeProxyModel);
    Q_ASSERT(checkIndex(index, CheckIndexOption::DoNotUseParent));
    if (!d->model || !index.isValid())
        return QModelIndex();
    return d->uncheckedMapFromSource(d->uncheckedMapToSource(index).parent());
}